

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

bool __thiscall llvm::detail::IEEEFloat::getExactInverse(IEEEFloat *this,APFloat *inv)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  opStatus oVar4;
  IEEEFloat local_78;
  APFloat local_60;
  undefined4 local_3c;
  undefined1 local_38 [8];
  IEEEFloat reciprocal;
  APFloat *inv_local;
  IEEEFloat *this_local;
  
  reciprocal._16_8_ = inv;
  bVar1 = isFiniteNonZero(this);
  if (bVar1) {
    uVar3 = significandLSB(this);
    if (uVar3 == this->semantics->precision - 1) {
      IEEEFloat((IEEEFloat *)local_38,this->semantics,1);
      oVar4 = divide((IEEEFloat *)local_38,this,rmNearestTiesToEven);
      if (oVar4 == opOK) {
        bVar1 = isDenormal((IEEEFloat *)local_38);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          bVar2 = isFiniteNonZero((IEEEFloat *)local_38);
          bVar1 = false;
          if (bVar2) {
            uVar3 = significandLSB((IEEEFloat *)local_38);
            bVar1 = uVar3 == *(uint *)((long)local_38 + 4) - 1;
          }
          if (!bVar1) {
            __assert_fail("reciprocal.isFiniteNonZero() && reciprocal.significandLSB() == reciprocal.semantics->precision - 1"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                          ,0xe33,"bool llvm::detail::IEEEFloat::getExactInverse(APFloat *) const");
          }
          if (reciprocal._16_8_ != 0) {
            IEEEFloat(&local_78,(IEEEFloat *)local_38);
            APFloat::APFloat(&local_60,&local_78,this->semantics);
            APFloat::operator=((APFloat *)reciprocal._16_8_,&local_60);
            APFloat::~APFloat(&local_60);
            ~IEEEFloat(&local_78);
          }
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
      local_3c = 1;
      ~IEEEFloat((IEEEFloat *)local_38);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool IEEEFloat::getExactInverse(APFloat *inv) const {
  // Special floats and denormals have no exact inverse.
  if (!isFiniteNonZero())
    return false;

  // Check that the number is a power of two by making sure that only the
  // integer bit is set in the significand.
  if (significandLSB() != semantics->precision - 1)
    return false;

  // Get the inverse.
  IEEEFloat reciprocal(*semantics, 1ULL);
  if (reciprocal.divide(*this, rmNearestTiesToEven) != opOK)
    return false;

  // Avoid multiplication with a denormal, it is not safe on all platforms and
  // may be slower than a normal division.
  if (reciprocal.isDenormal())
    return false;

  assert(reciprocal.isFiniteNonZero() &&
         reciprocal.significandLSB() == reciprocal.semantics->precision - 1);

  if (inv)
    *inv = APFloat(reciprocal, *semantics);

  return true;
}